

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

int Fraig_CompareSimInfoUnderMask
              (Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand,uint *puMask)

{
  uint *puVar1;
  uint *local_58;
  int local_44;
  int i;
  uint *pSims2;
  uint *pSims1;
  uint *puMask_local;
  int fUseRand_local;
  int iWordLast_local;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigTable.c"
                  ,0x1c7,
                  "int Fraig_CompareSimInfoUnderMask(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
                 );
  }
  if (((ulong)pNode2 & 1) == 0) {
    if (fUseRand == 0) {
      puVar1 = pNode1->puSimD;
      local_58 = pNode2->puSimD;
    }
    else {
      puVar1 = pNode1->puSimR;
      local_58 = pNode2->puSimR;
    }
    local_44 = 0;
    while( true ) {
      if (iWordLast <= local_44) {
        return 1;
      }
      if ((puVar1[local_44] & puMask[local_44]) != (local_58[local_44] & puMask[local_44])) break;
      local_44 = local_44 + 1;
    }
    return 0;
  }
  __assert_fail("!Fraig_IsComplement(pNode2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigTable.c"
                ,0x1c8,
                "int Fraig_CompareSimInfoUnderMask(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
               );
}

Assistant:

int Fraig_CompareSimInfoUnderMask( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand, unsigned * puMask )
{
    unsigned * pSims1, * pSims2;
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // get hold of simulation info
    pSims1 = fUseRand? pNode1->puSimR : pNode1->puSimD;
    pSims2 = fUseRand? pNode2->puSimR : pNode2->puSimD;    
    // check the simulation info
    for ( i = 0; i < iWordLast; i++ )
        if ( (pSims1[i] & puMask[i]) != (pSims2[i] & puMask[i]) )
            return 0;
    return 1;
}